

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O2

NodeRef __thiscall
embree::sse2::BVHNBuilderVirtual<4>::BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::QuadMv<4>_>_>
::createLeaf(BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::QuadMv<4>_>_> *this,PrimRef *prims,
            range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  undefined4 *puVar2;
  char *pcVar3;
  float fVar4;
  FastAllocator *this_00;
  ThreadLocal *pTVar5;
  ThreadLocal2 *this_01;
  Scene *pSVar6;
  Geometry *pGVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  MutexSys *pMVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  MutexSys *pMVar23;
  ulong uVar24;
  char *pcVar25;
  ulong uVar26;
  ulong uVar27;
  size_t sVar28;
  ulong uVar29;
  long lVar30;
  float *pfVar31;
  ulong uVar32;
  long lVar33;
  Lock<embree::MutexSys> local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  Lock<embree::MutexSys> local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  MutexSys *local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::QuadMv<4>_>_> *local_98;
  range<unsigned_long> *local_90;
  value_type local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  vuint<4> vprimID;
  vuint<4> vgeomID;
  
  uVar27 = set->_begin;
  uVar24 = (set->_end - uVar27) + 3 >> 2;
  local_c8 = (MutexSys *)(uVar24 * 0xe0);
  this_00 = alloc->alloc;
  pTVar5 = alloc->talloc1;
  this_01 = pTVar5->parent;
  local_98 = this;
  local_90 = set;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_f8.locked = true;
    local_f8.mutex = &this_01->mutex;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_128.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    local_128.locked = true;
    local_88 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,&local_88);
    Lock<embree::MutexSys>::~Lock(&local_128);
    Lock<embree::MutexSys>::~Lock(&local_f8);
  }
  pMVar23 = local_c8;
  pTVar5->bytesUsed = (long)&local_c8->mutex + pTVar5->bytesUsed;
  sVar28 = pTVar5->cur;
  uVar29 = (ulong)(-(int)sVar28 & 0xf);
  uVar26 = (long)&local_c8->mutex + uVar29 + sVar28;
  pTVar5->cur = uVar26;
  if (pTVar5->end < uVar26) {
    pTVar5->cur = sVar28;
    pMVar10 = (MutexSys *)pTVar5->allocBlockSize;
    if ((MutexSys *)((long)local_c8 * 4) < pMVar10 || (long)local_c8 * 4 - (long)pMVar10 == 0) {
      local_128.mutex = pMVar10;
      pcVar25 = (char *)FastAllocator::malloc(this_00,(size_t)&local_128);
      pTVar5->ptr = pcVar25;
      sVar28 = (pTVar5->end - pTVar5->cur) + pTVar5->bytesWasted;
      pTVar5->bytesWasted = sVar28;
      pTVar5->end = (size_t)local_128.mutex;
      pTVar5->cur = (size_t)pMVar23;
      if (local_128.mutex < pMVar23) {
        pTVar5->cur = 0;
        local_128.mutex = (MutexSys *)pTVar5->allocBlockSize;
        pcVar25 = (char *)FastAllocator::malloc(this_00,(size_t)&local_128);
        pTVar5->ptr = pcVar25;
        sVar28 = (pTVar5->end - pTVar5->cur) + pTVar5->bytesWasted;
        pTVar5->bytesWasted = sVar28;
        pTVar5->end = (size_t)local_128.mutex;
        pTVar5->cur = (size_t)pMVar23;
        if (local_128.mutex < pMVar23) {
          pTVar5->cur = 0;
          pcVar25 = (char *)0x0;
          goto LAB_004722de;
        }
      }
      pTVar5->bytesWasted = sVar28;
    }
    else {
      pcVar25 = (char *)FastAllocator::malloc(this_00,(size_t)&local_c8);
    }
  }
  else {
    pTVar5->bytesWasted = pTVar5->bytesWasted + uVar29;
    pcVar25 = pTVar5->ptr + (uVar26 - (long)local_c8);
  }
LAB_004722de:
  for (uVar26 = 0; uVar26 != uVar24; uVar26 = uVar26 + 1) {
    uVar29 = local_90->_end;
    pSVar6 = ((local_98->createLeafFunc).bvh)->scene;
    vgeomID.field_0.i[0] = 0xffffffff;
    vgeomID.field_0.i[1] = 0xffffffff;
    vgeomID.field_0.i[2] = 0xffffffff;
    vgeomID.field_0.i[3] = 0xffffffff;
    vprimID.field_0.i[0] = 0xffffffff;
    vprimID.field_0.i[1] = 0xffffffff;
    vprimID.field_0.i[2] = 0xffffffff;
    vprimID.field_0.i[3] = 0xffffffff;
    local_108 = 0;
    uStack_100 = 0;
    local_118 = 0;
    uStack_110 = 0;
    local_128.mutex = (MutexSys *)0x0;
    local_128.locked = false;
    local_128._9_7_ = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_f8.mutex = (MutexSys *)0x0;
    local_f8.locked = false;
    local_f8._9_7_ = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = (value_type)0x0;
    uStack_80 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_c8 = (MutexSys *)0x0;
    uStack_c0 = 0;
    pfVar31 = prims[uVar27].upper.field_0.m128 + 3;
    for (uVar32 = 0; (uVar32 < 4 && (uVar27 + uVar32 < uVar29)); uVar32 = uVar32 + 1) {
      fVar4 = *pfVar31;
      pGVar7 = (pSVar6->geometries).items[(uint)pfVar31[-4]].ptr;
      lVar33 = (ulong)(uint)fVar4 *
               pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar30 = *(long *)&pGVar7->field_0x58;
      lVar8 = *(long *)&pGVar7[1].time_range.upper;
      p_Var9 = pGVar7[1].intersectionFilterN;
      puVar2 = (undefined4 *)(lVar8 + (ulong)*(uint *)(lVar30 + lVar33) * (long)p_Var9);
      uVar11 = *puVar2;
      uVar12 = puVar2[1];
      uVar13 = puVar2[2];
      puVar2 = (undefined4 *)(lVar8 + (ulong)*(uint *)(lVar30 + 4 + lVar33) * (long)p_Var9);
      uVar14 = *puVar2;
      uVar15 = puVar2[1];
      uVar16 = puVar2[2];
      puVar2 = (undefined4 *)(lVar8 + (ulong)*(uint *)(lVar30 + 8 + lVar33) * (long)p_Var9);
      uVar17 = *puVar2;
      uVar18 = puVar2[1];
      uVar19 = puVar2[2];
      puVar2 = (undefined4 *)(lVar8 + (ulong)*(uint *)(lVar30 + 0xc + lVar33) * (long)p_Var9);
      uVar20 = *puVar2;
      uVar21 = puVar2[1];
      uVar22 = puVar2[2];
      vgeomID.field_0.i[uVar32] = (uint)pfVar31[-4];
      vprimID.field_0.i[uVar32] = (uint)fVar4;
      *(undefined4 *)((long)&local_128.mutex + uVar32 * 4) = uVar11;
      *(undefined4 *)((long)&local_118 + uVar32 * 4) = uVar12;
      *(undefined4 *)((long)&local_108 + uVar32 * 4) = uVar13;
      *(undefined4 *)((long)&local_f8.mutex + uVar32 * 4) = uVar14;
      *(undefined4 *)((long)&local_e8 + uVar32 * 4) = uVar15;
      *(undefined4 *)((long)&local_d8 + uVar32 * 4) = uVar16;
      *(undefined4 *)((long)&local_88 + uVar32 * 4) = uVar17;
      *(undefined4 *)((long)&local_78 + uVar32 * 4) = uVar18;
      *(undefined4 *)((long)&local_68 + uVar32 * 4) = uVar19;
      *(undefined4 *)((long)&local_c8 + uVar32 * 4) = uVar20;
      *(undefined4 *)((long)&local_b8 + uVar32 * 4) = uVar21;
      *(undefined4 *)((long)&local_a8 + uVar32 * 4) = uVar22;
      pfVar31 = pfVar31 + 8;
    }
    lVar30 = uVar26 * 0xe0;
    pcVar3 = pcVar25 + lVar30;
    *(MutexSys **)pcVar3 = local_128.mutex;
    pcVar3[8] = local_128.locked;
    pcVar3[9] = local_128._9_1_;
    pcVar3[10] = local_128._10_1_;
    pcVar3[0xb] = local_128._11_1_;
    pcVar3[0xc] = local_128._12_1_;
    pcVar3[0xd] = local_128._13_1_;
    pcVar3[0xe] = local_128._14_1_;
    pcVar3[0xf] = local_128._15_1_;
    *(undefined8 *)(pcVar25 + lVar30 + 0x10) = local_118;
    *(undefined8 *)(pcVar25 + lVar30 + 0x10 + 8) = uStack_110;
    *(undefined8 *)(pcVar25 + lVar30 + 0x20) = local_108;
    *(undefined8 *)(pcVar25 + lVar30 + 0x20 + 8) = uStack_100;
    pcVar3 = pcVar25 + lVar30 + 0x30;
    *(MutexSys **)pcVar3 = local_f8.mutex;
    pcVar3[8] = local_f8.locked;
    pcVar3[9] = local_f8._9_1_;
    pcVar3[10] = local_f8._10_1_;
    pcVar3[0xb] = local_f8._11_1_;
    pcVar3[0xc] = local_f8._12_1_;
    pcVar3[0xd] = local_f8._13_1_;
    pcVar3[0xe] = local_f8._14_1_;
    pcVar3[0xf] = local_f8._15_1_;
    *(undefined8 *)(pcVar25 + lVar30 + 0x40) = local_e8;
    *(undefined8 *)(pcVar25 + lVar30 + 0x40 + 8) = uStack_e0;
    *(undefined8 *)(pcVar25 + lVar30 + 0x50) = local_d8;
    *(undefined8 *)(pcVar25 + lVar30 + 0x50 + 8) = uStack_d0;
    *(value_type *)(pcVar25 + lVar30 + 0x60) = local_88;
    *(undefined8 *)(pcVar25 + lVar30 + 0x60 + 8) = uStack_80;
    *(undefined8 *)(pcVar25 + lVar30 + 0x70) = local_78;
    *(undefined8 *)(pcVar25 + lVar30 + 0x70 + 8) = uStack_70;
    *(undefined8 *)(pcVar25 + lVar30 + 0x80) = local_68;
    *(undefined8 *)(pcVar25 + lVar30 + 0x80 + 8) = uStack_60;
    *(MutexSys **)(pcVar25 + lVar30 + 0x90) = local_c8;
    *(undefined8 *)(pcVar25 + lVar30 + 0x90 + 8) = uStack_c0;
    *(undefined8 *)(pcVar25 + lVar30 + 0xa0) = local_b8;
    *(undefined8 *)(pcVar25 + lVar30 + 0xa0 + 8) = uStack_b0;
    *(undefined8 *)(pcVar25 + lVar30 + 0xb0) = local_a8;
    *(undefined8 *)(pcVar25 + lVar30 + 0xb0 + 8) = uStack_a0;
    *(ulong *)(pcVar25 + lVar30 + 0xc0) = CONCAT44(vgeomID.field_0.i[1],vgeomID.field_0.i[0]);
    *(ulong *)(pcVar25 + lVar30 + 0xc0 + 8) = CONCAT44(vgeomID.field_0.i[3],vgeomID.field_0.i[2]);
    *(ulong *)(pcVar25 + lVar30 + 0xd0) = CONCAT44(vprimID.field_0.i[1],vprimID.field_0.i[0]);
    *(ulong *)(pcVar25 + lVar30 + 0xd0 + 8) = CONCAT44(vprimID.field_0.i[3],vprimID.field_0.i[2]);
    uVar27 = uVar27 + uVar32;
  }
  uVar27 = 7;
  if (uVar24 < 7) {
    uVar27 = uVar24;
  }
  return (NodeRef)(uVar27 | (ulong)pcVar25 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }